

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int statement(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  node_t pvVar2;
  int iVar3;
  
  iVar1 = compound_statement();
  iVar3 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  if (t->id == 0x83) {
    last_id = 0x83;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    pvVar2 = assignment_expression();
    iVar1 = expect(0x3b);
    if (iVar1 == 0) {
      sync();
      if (extraout_EAX != 0) {
        return 1;
      }
      goto LAB_00106286;
    }
    pvVar2 = jump(0x83,pvVar2);
LAB_001062a4:
    ast_add_node(pvVar2);
  }
  else {
LAB_00106286:
    pvVar2 = assignment_expression();
    if (pvVar2 == (node_t)0x0) {
      if (t->id == 0x3b) {
        last_id = 0x3b;
        t = get_token();
        eline = t->line;
        ecolumn = t->column;
        return 1;
      }
    }
    else {
      iVar1 = expect(0x3b);
      if (iVar1 != 0) goto LAB_001062a4;
      sync();
      if (extraout_EAX_00 != 0) {
        return 1;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int statement()
{
    if (compound_statement())
        return 1;
    else if (jump_statement())
        return 1;
    /* expression_statement() has to be the last in the list, as in case of
       error it will try to resync on a ";" and yield true if synced, making the
       statement an empty statement and allowing the parsing to continue */
    else if (expression_statement())
        return 1;

    return 0;
}